

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void sx__coro_yield(sx_coro_context *ctx,sx_fiber_t *pfrom,int nupdates)

{
  int nupdates_local;
  sx_fiber_t *pfrom_local;
  sx_coro_context *ctx_local;
  
  sx__coro_return(ctx,pfrom,CORO_RET_YIELD,nupdates);
  return;
}

Assistant:

void sx__coro_yield(sx_coro_context* ctx, sx_fiber_t* pfrom, int nupdates)
{
    sx__coro_return(ctx, pfrom, CORO_RET_YIELD, nupdates);
}